

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.hpp
# Opt level: O0

conflicting_param * __thiscall
boost::runtime::specific_param_error<boost::runtime::conflicting_param,boost::runtime::init_error>::
operator<<(specific_param_error<boost::runtime::conflicting_param,_boost::runtime::init_error> *this
          ,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val)

{
  long in_RSI;
  conflicting_param *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000128;
  conflicting_param *in_stack_ffffffffffffff88;
  conflicting_param *this_00;
  string local_38 [56];
  
  this_00 = in_RDI;
  unit_test::utils::string_cast<std::__cxx11::string>(in_stack_00000128);
  std::__cxx11::string::append((string *)(in_RSI + 0x18));
  std::__cxx11::string::~string(local_38);
  conflicting_param::conflicting_param(this_00,in_stack_ffffffffffffff88);
  return in_RDI;
}

Assistant:

Derived operator<<(T const& val) &&
    {
        this->msg.append( unit_test::utils::string_cast( val ) );

        return reinterpret_cast<Derived&&>(*this);
    }